

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O3

void icetCompressedSubComposite
               (IceTImage destBuffer,IceTSizeType offset,IceTSparseImage srcBuffer,int srcOnTop)

{
  byte bVar1;
  IceTFloat IVar2;
  int iVar3;
  int iVar4;
  IceTFloat *pIVar5;
  IceTUInt *pIVar6;
  IceTFloat *pIVar7;
  char *pcVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  IceTBitField level;
  int *piVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  IceTFloat *pIVar16;
  int *piVar17;
  float fVar18;
  IceTFloat IVar19;
  IceTEnum type;
  long lVar20;
  char *msg;
  long lVar21;
  long lVar22;
  uint uVar23;
  char cVar24;
  float fVar25;
  IceTEnum _composite_mode;
  IceTUInt _background_color;
  IceTEnum local_4c;
  IceTFloat local_48 [6];
  
  icetTimingBlendBegin();
  if (srcOnTop == 0) {
    icetGetEnumv(0x28,&local_4c);
    if (srcBuffer.opaque_internals == (IceTVoid *)0x0) {
      iVar9 = 0xd000;
      iVar4 = 0xc000;
      iVar3 = 0;
      if (destBuffer.opaque_internals != (IceTVoid *)0x0) goto LAB_00113ffb;
      cVar24 = '\x01';
      iVar11 = 0;
LAB_001147a4:
      if (iVar11 - offset < iVar3) goto LAB_00114023;
    }
    else {
      iVar4 = *(int *)((long)srcBuffer.opaque_internals + 4);
      iVar9 = *(int *)((long)srcBuffer.opaque_internals + 8);
      iVar3 = *(int *)((long)srcBuffer.opaque_internals + 0x10) *
              *(int *)((long)srcBuffer.opaque_internals + 0xc);
      if (destBuffer.opaque_internals == (IceTVoid *)0x0) {
        cVar24 = '\x01';
        if (iVar4 == 0xc000) {
          iVar4 = 0xc000;
          iVar10 = 1;
          cVar24 = '\x01';
          iVar11 = 0xd000;
          if (iVar9 == 0xd000) goto LAB_00114261;
        }
      }
      else {
LAB_00113ffb:
        if ((iVar4 == *(int *)((long)destBuffer.opaque_internals + 4)) &&
           (iVar10 = 0, iVar9 == *(int *)((long)destBuffer.opaque_internals + 8))) {
          cVar24 = '\0';
          iVar11 = iVar9;
          if (srcBuffer.opaque_internals != (IceTVoid *)0x0) {
LAB_00114261:
            iVar9 = iVar11;
            cVar24 = (char)iVar10;
            iVar10 = *(int *)((long)srcBuffer.opaque_internals + 0x10) *
                     *(int *)((long)srcBuffer.opaque_internals + 0xc);
          }
          if (iVar3 == iVar10) {
            if (cVar24 == '\0') {
              iVar11 = *(int *)((long)destBuffer.opaque_internals + 0x10) *
                       *(int *)((long)destBuffer.opaque_internals + 0xc);
              cVar24 = '\0';
            }
            else {
              iVar11 = 0;
              cVar24 = '\x01';
            }
            goto LAB_001147a4;
          }
        }
        else {
          cVar24 = '\0';
        }
      }
LAB_00114023:
      icetRaiseDiagnostic("Input/output buffers do not agree for decompression.",0xffffffff,1,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_func_body.h"
                          ,0x58);
    }
    if (local_4c == 0x302) {
      if (iVar9 != 0xd000) {
        icetRaiseDiagnostic("Z buffer ignored during blend composite operation.  Output z buffer meaningless."
                            ,0xfffffffa,3,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_func_body.h"
                            ,0xf0);
      }
      if (iVar4 != 0xc000) {
        if (iVar4 == 0xc002) {
          if ((cVar24 == '\0') && (*(int *)((long)destBuffer.opaque_internals + 4) == 0xc002)) {
            lVar20 = (long)destBuffer.opaque_internals + 0x1c;
          }
          else {
            icetRaiseDiagnostic("Color format is not of type float.",0xfffffffb,1,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                                ,0x2ae);
            lVar20 = 0;
          }
          icetGetFloatv(5,local_48);
          if ((srcBuffer.opaque_internals != (IceTVoid *)0x0) &&
             (iVar4 = *(int *)((long)srcBuffer.opaque_internals + 0x10) *
                      *(int *)((long)srcBuffer.opaque_internals + 0xc), 0 < iVar4)) {
            pfVar13 = (float *)(lVar20 + (long)(offset << 2) * 4);
            pfVar15 = (float *)((long)srcBuffer.opaque_internals + 0x1c);
            iVar9 = 0;
            do {
              iVar9 = iVar9 + (int)*pfVar15;
              if (iVar4 < iVar9) goto LAB_001149ed;
              fVar18 = pfVar15[1];
              iVar9 = iVar9 + (int)fVar18;
              if (iVar4 < iVar9) goto LAB_001149f5;
              pfVar13 = pfVar13 + (long)(int)*pfVar15 * 4;
              pfVar15 = pfVar15 + 2;
              if (0 < (int)fVar18) {
                do {
                  fVar25 = 1.0 - pfVar13[3];
                  *pfVar13 = *pfVar15 * fVar25 + *pfVar13;
                  pfVar13[1] = pfVar15[1] * fVar25 + pfVar13[1];
                  pfVar13[2] = pfVar15[2] * fVar25 + pfVar13[2];
                  pfVar14 = pfVar15 + 3;
                  pfVar15 = pfVar15 + 4;
                  pfVar13[3] = fVar25 * *pfVar14 + pfVar13[3];
                  pfVar13 = pfVar13 + 4;
                  fVar18 = (float)((int)fVar18 + -1);
                } while (fVar18 != 0.0);
              }
            } while (iVar9 < iVar4);
          }
          goto LAB_00114a18;
        }
        if (iVar4 == 0xc001) {
          if ((cVar24 == '\0') && (*(int *)((long)destBuffer.opaque_internals + 4) == 0xc001)) {
            lVar20 = (long)destBuffer.opaque_internals + 0x1c;
          }
          else {
            icetRaiseDiagnostic("Color format is not of type ubyte.",0xfffffffb,1,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                                ,0x292);
            lVar20 = 0;
          }
          icetGetIntegerv(6,(IceTInt *)local_48);
          if ((srcBuffer.opaque_internals != (IceTVoid *)0x0) &&
             (iVar4 = *(int *)((long)srcBuffer.opaque_internals + 0x10) *
                      *(int *)((long)srcBuffer.opaque_internals + 0xc), 0 < iVar4)) {
            lVar20 = lVar20 + (long)offset * 4;
            iVar9 = 0;
            piVar17 = (int *)((long)srcBuffer.opaque_internals + 0x1c);
            do {
              iVar9 = iVar9 + *piVar17;
              if (iVar4 < iVar9) goto LAB_001149ed;
              iVar3 = piVar17[1];
              iVar9 = iVar9 + iVar3;
              if (iVar4 < iVar9) goto LAB_001149f5;
              lVar20 = lVar20 + (long)*piVar17 * 4;
              piVar12 = piVar17 + 2;
              if (0 < iVar3) {
                lVar21 = 0;
                lVar22 = 0;
                do {
                  bVar1 = *(byte *)(lVar20 + 3 + lVar22 * 4);
                  uVar23 = bVar1 ^ 0xff;
                  pcVar8 = (char *)(lVar20 + lVar22 * 4);
                  *pcVar8 = *pcVar8 + (char)((*(byte *)(piVar12 + lVar22) * uVar23) / 0xff);
                  pcVar8 = (char *)(lVar20 + 1 + lVar22 * 4);
                  *pcVar8 = *pcVar8 + (char)((*(byte *)((long)piVar17 + lVar22 * 4 + 9) * uVar23) /
                                            0xff);
                  pcVar8 = (char *)(lVar20 + 2 + lVar22 * 4);
                  *pcVar8 = *pcVar8 + (char)((*(byte *)((long)piVar17 + lVar22 * 4 + 10) * uVar23) /
                                            0xff);
                  *(byte *)(lVar20 + 3 + lVar22 * 4) =
                       (char)((*(byte *)((long)piVar17 + lVar22 * 4 + 0xb) * uVar23) / 0xff) + bVar1
                  ;
                  lVar22 = lVar22 + 1;
                  lVar21 = lVar21 + -4;
                } while (iVar3 != (int)lVar22);
                piVar12 = (int *)((long)piVar12 - lVar21);
                lVar20 = lVar20 - lVar21;
              }
              piVar17 = piVar12;
            } while (iVar9 < iVar4);
          }
          goto LAB_00114a18;
        }
        goto LAB_001142b3;
      }
LAB_00114290:
      msg = "Decompressing image with no data.";
      pcVar8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_func_body.h"
      ;
      type = 0xfffffffb;
      level = 3;
      iVar4 = 0x13f;
    }
    else {
      if (local_4c != 0x301) goto LAB_00114158;
      if (iVar9 == 0xd000) goto LAB_001141ee;
      if (iVar9 == 0xd001) {
        pIVar5 = icetImageGetDepthcf(destBuffer);
        pIVar5 = pIVar5 + offset;
        if (iVar4 == 0xc000) {
          if ((srcBuffer.opaque_internals != (IceTVoid *)0x0) &&
             (iVar4 = *(int *)((long)srcBuffer.opaque_internals + 0x10) *
                      *(int *)((long)srcBuffer.opaque_internals + 0xc), 0 < iVar4)) {
            piVar17 = (int *)((long)srcBuffer.opaque_internals + 0x1c);
            iVar9 = 0;
            do {
              iVar9 = iVar9 + *piVar17;
              if (iVar4 < iVar9) goto LAB_00114a91;
              iVar3 = piVar17[1];
              iVar9 = iVar9 + iVar3;
              if (iVar4 < iVar9) goto LAB_00114ab4;
              pIVar5 = pIVar5 + *piVar17;
              piVar17 = piVar17 + 2;
              if (0 < iVar3) {
                lVar20 = 0;
                lVar21 = 0;
                do {
                  if ((float)piVar17[lVar21] < (float)pIVar5[lVar21]) {
                    pIVar5[lVar21] = (IceTFloat)piVar17[lVar21];
                  }
                  lVar21 = lVar21 + 1;
                  lVar20 = lVar20 + -4;
                } while (iVar3 != (int)lVar21);
                piVar17 = (int *)((long)piVar17 - lVar20);
                pIVar5 = (IceTFloat *)((long)pIVar5 - lVar20);
              }
            } while (iVar9 < iVar4);
          }
          goto LAB_00114a18;
        }
        if (iVar4 == 0xc002) {
          pIVar7 = icetImageGetColorf(destBuffer);
          icetGetFloatv(5,local_48);
          if ((srcBuffer.opaque_internals != (IceTVoid *)0x0) &&
             (iVar4 = *(int *)((long)srcBuffer.opaque_internals + 0x10) *
                      *(int *)((long)srcBuffer.opaque_internals + 0xc), 0 < iVar4)) {
            pIVar7 = pIVar7 + (offset << 2);
            pIVar16 = (IceTFloat *)((long)srcBuffer.opaque_internals + 0x1c);
            iVar9 = 0;
            do {
              IVar2 = *pIVar16;
              if (iVar4 < iVar9 + (int)IVar2) goto LAB_001149ed;
              IVar19 = pIVar16[1];
              iVar9 = iVar9 + (int)IVar2 + (int)IVar19;
              if (iVar4 < iVar9) goto LAB_001149f5;
              pIVar5 = pIVar5 + (int)IVar2;
              pIVar7 = pIVar7 + (int)IVar2 * 4;
              pIVar16 = pIVar16 + 2;
              if (0 < (int)IVar19) {
                lVar21 = 0;
                lVar20 = 0;
                do {
                  if ((float)pIVar16[4] <= *(float *)((long)pIVar5 + lVar20) &&
                      *(float *)((long)pIVar5 + lVar20) != (float)pIVar16[4]) {
                    pIVar7[lVar20] = *pIVar16;
                    pIVar7[lVar20 + 1] = pIVar16[1];
                    pIVar7[lVar20 + 2] = pIVar16[2];
                    pIVar7[lVar20 + 3] = pIVar16[3];
                    *(IceTFloat *)((long)pIVar5 + lVar20) = pIVar16[4];
                  }
                  pIVar16 = pIVar16 + 5;
                  lVar20 = lVar20 + 4;
                  lVar21 = lVar21 + -0x10;
                  IVar19 = (IceTFloat)((int)IVar19 + -1);
                } while (IVar19 != 0.0);
                pIVar7 = (IceTFloat *)((long)pIVar7 - lVar21);
                pIVar5 = (IceTFloat *)((long)pIVar5 + lVar20);
              }
            } while (iVar9 < iVar4);
          }
          goto LAB_00114a18;
        }
        if (iVar4 == 0xc001) {
          pIVar6 = icetImageGetColorui(destBuffer);
          icetGetIntegerv(6,(IceTInt *)local_48);
          if ((srcBuffer.opaque_internals != (IceTVoid *)0x0) &&
             (iVar4 = *(int *)((long)srcBuffer.opaque_internals + 0x10) *
                      *(int *)((long)srcBuffer.opaque_internals + 0xc), 0 < iVar4)) {
            pIVar6 = pIVar6 + offset;
            iVar9 = 0;
            piVar17 = (int *)((long)srcBuffer.opaque_internals + 0x1c);
            do {
              iVar3 = *piVar17;
              if (iVar4 < iVar9 + iVar3) goto LAB_001149ed;
              iVar11 = piVar17[1];
              iVar9 = iVar9 + iVar3 + iVar11;
              if (iVar4 < iVar9) goto LAB_001149f5;
              pIVar5 = pIVar5 + iVar3;
              pIVar6 = pIVar6 + iVar3;
              piVar12 = piVar17 + 2;
              if (0 < iVar11) {
                lVar21 = 0;
                lVar20 = 0;
                do {
                  fVar18 = *(float *)((long)piVar17 + lVar20 * 2 + 0xc);
                  if (fVar18 < *(float *)((long)pIVar5 + lVar20)) {
                    *(undefined4 *)((long)pIVar6 + lVar20) =
                         *(undefined4 *)((long)piVar12 + lVar20 * 2);
                    *(float *)((long)pIVar5 + lVar20) = fVar18;
                  }
                  lVar20 = lVar20 + 4;
                  lVar21 = lVar21 + -8;
                  iVar11 = iVar11 + -1;
                } while (iVar11 != 0);
                piVar12 = (int *)((long)piVar12 - lVar21);
                pIVar6 = (IceTUInt *)((long)pIVar6 + lVar20);
                pIVar5 = (IceTFloat *)((long)pIVar5 + lVar20);
              }
              piVar17 = piVar12;
            } while (iVar9 < iVar4);
          }
          goto LAB_00114a18;
        }
        goto LAB_00114559;
      }
LAB_00114211:
      msg = "Encountered invalid depth format.";
      pcVar8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_func_body.h"
      ;
      type = 0xffffffff;
      level = 1;
      iVar4 = 0xe9;
    }
  }
  else {
    icetGetEnumv(0x28,&local_4c);
    if (srcBuffer.opaque_internals == (IceTVoid *)0x0) {
      iVar9 = 0xd000;
      iVar4 = 0xc000;
      iVar3 = 0;
      if (destBuffer.opaque_internals != (IceTVoid *)0x0) goto LAB_00113dc3;
      cVar24 = '\x01';
      iVar11 = 0;
LAB_00114532:
      if (iVar11 - offset < iVar3) goto LAB_00113deb;
    }
    else {
      iVar4 = *(int *)((long)srcBuffer.opaque_internals + 4);
      iVar9 = *(int *)((long)srcBuffer.opaque_internals + 8);
      iVar3 = *(int *)((long)srcBuffer.opaque_internals + 0x10) *
              *(int *)((long)srcBuffer.opaque_internals + 0xc);
      if (destBuffer.opaque_internals == (IceTVoid *)0x0) {
        cVar24 = '\x01';
        if (iVar4 == 0xc000) {
          iVar4 = 0xc000;
          iVar10 = 1;
          cVar24 = '\x01';
          iVar11 = 0xd000;
          if (iVar9 == 0xd000) goto LAB_00113fc0;
        }
      }
      else {
LAB_00113dc3:
        if ((iVar4 == *(int *)((long)destBuffer.opaque_internals + 4)) &&
           (iVar10 = 0, iVar9 == *(int *)((long)destBuffer.opaque_internals + 8))) {
          cVar24 = '\0';
          iVar11 = iVar9;
          if (srcBuffer.opaque_internals != (IceTVoid *)0x0) {
LAB_00113fc0:
            iVar9 = iVar11;
            cVar24 = (char)iVar10;
            iVar10 = *(int *)((long)srcBuffer.opaque_internals + 0x10) *
                     *(int *)((long)srcBuffer.opaque_internals + 0xc);
          }
          if (iVar3 == iVar10) {
            if (cVar24 == '\0') {
              iVar11 = *(int *)((long)destBuffer.opaque_internals + 0x10) *
                       *(int *)((long)destBuffer.opaque_internals + 0xc);
              cVar24 = '\0';
            }
            else {
              iVar11 = 0;
              cVar24 = '\x01';
            }
            goto LAB_00114532;
          }
        }
        else {
          cVar24 = '\0';
        }
      }
LAB_00113deb:
      icetRaiseDiagnostic("Input/output buffers do not agree for decompression.",0xffffffff,1,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_func_body.h"
                          ,0x58);
    }
    if (local_4c == 0x302) {
      if (iVar9 != 0xd000) {
        icetRaiseDiagnostic("Z buffer ignored during blend composite operation.  Output z buffer meaningless."
                            ,0xfffffffa,3,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_func_body.h"
                            ,0xf0);
      }
      if (iVar4 == 0xc000) goto LAB_00114290;
      if (iVar4 == 0xc002) {
        if ((cVar24 == '\0') && (*(int *)((long)destBuffer.opaque_internals + 4) == 0xc002)) {
          lVar20 = (long)destBuffer.opaque_internals + 0x1c;
        }
        else {
          icetRaiseDiagnostic("Color format is not of type float.",0xfffffffb,1,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                              ,0x2ae);
          lVar20 = 0;
        }
        icetGetFloatv(5,local_48);
        if ((srcBuffer.opaque_internals != (IceTVoid *)0x0) &&
           (iVar4 = *(int *)((long)srcBuffer.opaque_internals + 0x10) *
                    *(int *)((long)srcBuffer.opaque_internals + 0xc), 0 < iVar4)) {
          pfVar15 = (float *)(lVar20 + (long)(offset << 2) * 4);
          pfVar13 = (float *)((long)srcBuffer.opaque_internals + 0x1c);
          iVar9 = 0;
          do {
            iVar9 = iVar9 + (int)*pfVar13;
            if (iVar4 < iVar9) goto LAB_001149ed;
            fVar18 = pfVar13[1];
            iVar9 = iVar9 + (int)fVar18;
            if (iVar4 < iVar9) goto LAB_001149f5;
            pfVar15 = pfVar15 + (long)(int)*pfVar13 * 4;
            pfVar13 = pfVar13 + 2;
            pfVar14 = pfVar13;
            if (0 < (int)fVar18) {
              do {
                fVar25 = 1.0 - pfVar14[3];
                pfVar13 = pfVar14 + 4;
                *pfVar15 = *pfVar15 * fVar25 + *pfVar14;
                pfVar15[1] = pfVar15[1] * fVar25 + pfVar14[1];
                pfVar15[2] = pfVar15[2] * fVar25 + pfVar14[2];
                pfVar15[3] = fVar25 * pfVar15[3] + pfVar14[3];
                pfVar15 = pfVar15 + 4;
                fVar18 = (float)((int)fVar18 + -1);
                pfVar14 = pfVar13;
              } while (fVar18 != 0.0);
            }
          } while (iVar9 < iVar4);
        }
        goto LAB_00114a18;
      }
      if (iVar4 == 0xc001) {
        if ((cVar24 == '\0') && (*(int *)((long)destBuffer.opaque_internals + 4) == 0xc001)) {
          lVar20 = (long)destBuffer.opaque_internals + 0x1c;
        }
        else {
          icetRaiseDiagnostic("Color format is not of type ubyte.",0xfffffffb,1,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                              ,0x292);
          lVar20 = 0;
        }
        icetGetIntegerv(6,(IceTInt *)local_48);
        if ((srcBuffer.opaque_internals != (IceTVoid *)0x0) &&
           (iVar4 = *(int *)((long)srcBuffer.opaque_internals + 0x10) *
                    *(int *)((long)srcBuffer.opaque_internals + 0xc), 0 < iVar4)) {
          lVar20 = lVar20 + (long)offset * 4;
          iVar9 = 0;
          piVar17 = (int *)((long)srcBuffer.opaque_internals + 0x1c);
          do {
            iVar9 = iVar9 + *piVar17;
            if (iVar4 < iVar9) goto LAB_001149ed;
            iVar3 = piVar17[1];
            iVar9 = iVar9 + iVar3;
            if (iVar4 < iVar9) goto LAB_001149f5;
            lVar20 = lVar20 + (long)*piVar17 * 4;
            piVar12 = piVar17 + 2;
            if (0 < iVar3) {
              lVar21 = 0;
              lVar22 = 0;
              do {
                uVar23 = *(byte *)((long)piVar17 + lVar22 * 4 + 0xb) ^ 0xff;
                *(char *)(lVar20 + lVar22 * 4) =
                     (char)((*(byte *)(lVar20 + lVar22 * 4) * uVar23) / 0xff) +
                     (char)piVar12[lVar22];
                *(char *)(lVar20 + 1 + lVar22 * 4) =
                     (char)((*(byte *)(lVar20 + 1 + lVar22 * 4) * uVar23) / 0xff) +
                     *(char *)((long)piVar17 + lVar22 * 4 + 9);
                *(char *)(lVar20 + 2 + lVar22 * 4) =
                     (char)((*(byte *)(lVar20 + 2 + lVar22 * 4) * uVar23) / 0xff) +
                     *(char *)((long)piVar17 + lVar22 * 4 + 10);
                *(char *)(lVar20 + 3 + lVar22 * 4) =
                     (char)((*(byte *)(lVar20 + 3 + lVar22 * 4) * uVar23) / 0xff) +
                     *(char *)((long)piVar17 + lVar22 * 4 + 0xb);
                lVar22 = lVar22 + 1;
                lVar21 = lVar21 + -4;
              } while (iVar3 != (int)lVar22);
              lVar20 = lVar20 - lVar21;
              piVar12 = (int *)((long)piVar12 - lVar21);
            }
            piVar17 = piVar12;
          } while (iVar9 < iVar4);
        }
        goto LAB_00114a18;
      }
LAB_001142b3:
      msg = "Encountered invalid color format.";
      pcVar8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_func_body.h"
      ;
      type = 0xffffffff;
      level = 1;
      iVar4 = 0x142;
    }
    else if (local_4c == 0x301) {
      if (iVar9 == 0xd000) {
LAB_001141ee:
        msg = "Cannot use Z buffer compositing operation with no Z buffer.";
        pcVar8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_func_body.h"
        ;
        type = 0xfffffffb;
        level = 1;
        iVar4 = 0xe6;
      }
      else {
        if (iVar9 != 0xd001) goto LAB_00114211;
        pIVar5 = icetImageGetDepthcf(destBuffer);
        pIVar5 = pIVar5 + offset;
        if (iVar4 == 0xc000) {
          if ((srcBuffer.opaque_internals != (IceTVoid *)0x0) &&
             (iVar4 = *(int *)((long)srcBuffer.opaque_internals + 0x10) *
                      *(int *)((long)srcBuffer.opaque_internals + 0xc), 0 < iVar4)) {
            piVar17 = (int *)((long)srcBuffer.opaque_internals + 0x1c);
            iVar9 = 0;
            do {
              iVar9 = iVar9 + *piVar17;
              if (iVar4 < iVar9) goto LAB_00114a91;
              iVar3 = piVar17[1];
              iVar9 = iVar9 + iVar3;
              if (iVar4 < iVar9) goto LAB_00114ab4;
              pIVar5 = pIVar5 + *piVar17;
              piVar17 = piVar17 + 2;
              if (0 < iVar3) {
                lVar20 = 0;
                lVar21 = 0;
                do {
                  if ((float)piVar17[lVar21] < (float)pIVar5[lVar21]) {
                    pIVar5[lVar21] = (IceTFloat)piVar17[lVar21];
                  }
                  lVar21 = lVar21 + 1;
                  lVar20 = lVar20 + -4;
                } while (iVar3 != (int)lVar21);
                pIVar5 = (IceTFloat *)((long)pIVar5 - lVar20);
                piVar17 = (int *)((long)piVar17 - lVar20);
              }
            } while (iVar9 < iVar4);
          }
          goto LAB_00114a18;
        }
        if (iVar4 == 0xc002) {
          pIVar7 = icetImageGetColorf(destBuffer);
          icetGetFloatv(5,local_48);
          if ((srcBuffer.opaque_internals != (IceTVoid *)0x0) &&
             (iVar4 = *(int *)((long)srcBuffer.opaque_internals + 0x10) *
                      *(int *)((long)srcBuffer.opaque_internals + 0xc), 0 < iVar4)) {
            pIVar7 = pIVar7 + (offset << 2);
            pIVar16 = (IceTFloat *)((long)srcBuffer.opaque_internals + 0x1c);
            iVar9 = 0;
            do {
              IVar2 = *pIVar16;
              if (iVar4 < iVar9 + (int)IVar2) goto LAB_001149ed;
              IVar19 = pIVar16[1];
              iVar9 = iVar9 + (int)IVar2 + (int)IVar19;
              if (iVar4 < iVar9) goto LAB_001149f5;
              pIVar5 = pIVar5 + (int)IVar2;
              pIVar7 = pIVar7 + (int)IVar2 * 4;
              pIVar16 = pIVar16 + 2;
              if (0 < (int)IVar19) {
                lVar20 = 0;
                lVar21 = 0;
                do {
                  if ((float)pIVar16[4] <= *(float *)((long)pIVar5 + lVar21) &&
                      *(float *)((long)pIVar5 + lVar21) != (float)pIVar16[4]) {
                    pIVar7[lVar21] = *pIVar16;
                    pIVar7[lVar21 + 1] = pIVar16[1];
                    pIVar7[lVar21 + 2] = pIVar16[2];
                    pIVar7[lVar21 + 3] = pIVar16[3];
                    *(IceTFloat *)((long)pIVar5 + lVar21) = pIVar16[4];
                  }
                  pIVar16 = pIVar16 + 5;
                  lVar21 = lVar21 + 4;
                  lVar20 = lVar20 + -0x10;
                  IVar19 = (IceTFloat)((int)IVar19 + -1);
                } while (IVar19 != 0.0);
                pIVar5 = (IceTFloat *)((long)pIVar5 + lVar21);
                pIVar7 = (IceTFloat *)((long)pIVar7 - lVar20);
              }
            } while (iVar9 < iVar4);
          }
          goto LAB_00114a18;
        }
        if (iVar4 == 0xc001) {
          pIVar6 = icetImageGetColorui(destBuffer);
          icetGetIntegerv(6,(IceTInt *)local_48);
          if ((srcBuffer.opaque_internals != (IceTVoid *)0x0) &&
             (iVar4 = *(int *)((long)srcBuffer.opaque_internals + 0x10) *
                      *(int *)((long)srcBuffer.opaque_internals + 0xc), 0 < iVar4)) {
            pIVar6 = pIVar6 + offset;
            iVar9 = 0;
            piVar17 = (int *)((long)srcBuffer.opaque_internals + 0x1c);
            do {
              iVar3 = *piVar17;
              if (iVar4 < iVar9 + iVar3) goto LAB_001149ed;
              iVar11 = piVar17[1];
              iVar9 = iVar9 + iVar3 + iVar11;
              if (iVar4 < iVar9) goto LAB_001149f5;
              pIVar5 = pIVar5 + iVar3;
              pIVar6 = pIVar6 + iVar3;
              piVar12 = piVar17 + 2;
              if (0 < iVar11) {
                lVar21 = 0;
                lVar20 = 0;
                do {
                  fVar18 = *(float *)((long)piVar17 + lVar20 * 2 + 0xc);
                  if (fVar18 < *(float *)((long)pIVar5 + lVar20)) {
                    *(undefined4 *)((long)pIVar6 + lVar20) =
                         *(undefined4 *)((long)piVar12 + lVar20 * 2);
                    *(float *)((long)pIVar5 + lVar20) = fVar18;
                  }
                  lVar20 = lVar20 + 4;
                  lVar21 = lVar21 + -8;
                  iVar11 = iVar11 + -1;
                } while (iVar11 != 0);
                piVar12 = (int *)((long)piVar12 - lVar21);
                pIVar5 = (IceTFloat *)((long)pIVar5 + lVar20);
                pIVar6 = (IceTUInt *)((long)pIVar6 + lVar20);
              }
              piVar17 = piVar12;
            } while (iVar9 < iVar4);
          }
          goto LAB_00114a18;
        }
LAB_00114559:
        msg = "Encountered invalid color format.";
        pcVar8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_func_body.h"
        ;
        type = 0xffffffff;
        level = 1;
        iVar4 = 0xe2;
      }
    }
    else {
LAB_00114158:
      msg = "Encountered invalid composite mode.";
      pcVar8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_func_body.h"
      ;
      type = 0xffffffff;
      level = 1;
      iVar4 = 0x146;
    }
  }
  goto LAB_00114a13;
LAB_00114a91:
  msg = "Corrupt compressed image.";
  pcVar8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_template_body.h"
  ;
  type = 0xfffffffa;
  level = 1;
  iVar4 = 0x3a;
  goto LAB_00114a13;
LAB_00114ab4:
  msg = "Corrupt compressed image.";
  pcVar8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_template_body.h"
  ;
  type = 0xfffffffa;
  level = 1;
  iVar4 = 0x43;
  goto LAB_00114a13;
LAB_001149ed:
  iVar4 = 0x3a;
  goto LAB_001149fb;
LAB_001149f5:
  iVar4 = 0x43;
LAB_001149fb:
  msg = "Corrupt compressed image.";
  pcVar8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_template_body.h"
  ;
  type = 0xfffffffa;
  level = 1;
LAB_00114a13:
  icetRaiseDiagnostic(msg,type,level,pcVar8,iVar4);
LAB_00114a18:
  icetTimingBlendEnd();
  return;
}

Assistant:

void icetCompressedSubComposite(IceTImage destBuffer,
                                IceTSizeType offset,
                                const IceTSparseImage srcBuffer,
                                int srcOnTop)
{
    icetTimingBlendBegin();

    if (srcOnTop) {
#define INPUT_SPARSE_IMAGE      srcBuffer
#define OUTPUT_IMAGE            destBuffer
#define OFFSET                  offset
#define PIXEL_COUNT             icetSparseImageGetNumPixels(srcBuffer)
#define COMPOSITE
#define BLEND_RGBA_UBYTE        ICET_OVER_UBYTE
#define BLEND_RGBA_FLOAT        ICET_OVER_FLOAT
#include "decompress_func_body.h"
    } else {
#define INPUT_SPARSE_IMAGE      srcBuffer
#define OUTPUT_IMAGE            destBuffer
#define OFFSET                  offset
#define PIXEL_COUNT             icetSparseImageGetNumPixels(srcBuffer)
#define COMPOSITE
#define BLEND_RGBA_UBYTE        ICET_UNDER_UBYTE
#define BLEND_RGBA_FLOAT        ICET_UNDER_FLOAT
#include "decompress_func_body.h"
    }

    icetTimingBlendEnd();
}